

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  size_t slotCount;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t lambdaClosure;
  sysbvm_tuple_t captureValue;
  sysbvm_tuple_t captureBinding;
  size_t i;
  sysbvm_tuple_t captureVector;
  size_t captureVectorSize;
  sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
  sysbvm_functionDefinition_t *functionDefinition;
  sysbvm_astLambdaNode_t **lambdaNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  lVar1 = *(long *)(*(long *)(*arguments + 0x60) + 0x78);
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(lVar1 + 0x20));
  sVar2 = sysbvm_array_create(context,slotCount);
  for (captureBinding = 0; captureBinding < slotCount; captureBinding = captureBinding + 1) {
    sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(lVar1 + 0x20),captureBinding);
    sVar3 = sysbvm_symbolCaptureBinding_getSourceBinding(sVar3);
    sVar3 = sysbvm_environment_evaluateSymbolBinding(context,arguments[1],sVar3);
    sysbvm_array_atPut(sVar2,captureBinding,sVar3);
  }
  sVar2 = sysbvm_function_createClosureWithCaptureVector
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x60),sVar2);
  if (*(long *)(*arguments + 0x68) != 0) {
    sysbvm_functionActivationEnvironment_setBindingActivationValue
              (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x68),sVar2,
               *(sysbvm_tuple_t *)(*arguments + 0x10));
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;

    sysbvm_functionDefinition_t *functionDefinition = (sysbvm_functionDefinition_t*)(*lambdaNode)->functionDefinition;
    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinition->sourceAnalyzedDefinition;

    size_t captureVectorSize = sysbvm_array_getSize(sourceAnalyzedDefinition->captures);
    sysbvm_tuple_t captureVector = sysbvm_array_create(context, captureVectorSize);
    for(size_t i = 0; i < captureVectorSize; ++i)
    {
        sysbvm_tuple_t captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(sourceAnalyzedDefinition->captures, i));
        sysbvm_tuple_t captureValue = sysbvm_environment_evaluateSymbolBinding(context, *environment, captureBinding);
        sysbvm_array_atPut(captureVector, i, captureValue);
    }

    sysbvm_tuple_t lambdaClosure = sysbvm_function_createClosureWithCaptureVector(context, (*lambdaNode)->functionDefinition, captureVector);
    if((*lambdaNode)->binding)
        sysbvm_functionActivationEnvironment_setBindingActivationValue(context, *environment, (*lambdaNode)->binding, lambdaClosure, (*lambdaNode)->super.sourcePosition);
    return lambdaClosure;
}